

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

void embree::avx::DiscMiMBIntersectorK<4,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  Scene *pSVar6;
  Geometry *pGVar7;
  long lVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  uint uVar11;
  undefined4 uVar12;
  RayHitK<4> *pRVar13;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  float fVar21;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar40;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar41 [64];
  float fVar45;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar46 [64];
  float fVar50;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined1 auVar51 [64];
  float fVar55;
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar56 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar65 [64];
  Scene *scene;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 *local_1a8;
  void *local_1a0;
  RTCRayQueryContext *local_198;
  RayHitK<4> *local_190;
  undefined1 (*local_188) [16];
  undefined4 local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [32];
  undefined1 local_138 [16];
  float local_128 [4];
  float local_118 [4];
  float local_108 [4];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  undefined1 local_88 [16];
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined1 local_58 [32];
  ulong uVar14;
  undefined1 auVar39 [64];
  
  pSVar6 = context->scene;
  uVar14 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar7 = (pSVar6->geometries).items[Disc->sharedGeomID].ptr;
  fVar1 = (pGVar7->time_range).lower;
  fVar1 = pGVar7->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0x70) - fVar1) / ((pGVar7->time_range).upper - fVar1));
  auVar33 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  auVar33 = vminss_avx(auVar33,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar33 = vmaxss_avx(ZEXT816(0) << 0x20,auVar33);
  fVar1 = fVar1 - auVar33._0_4_;
  lVar15 = *(long *)&pGVar7[2].numPrimitives;
  lVar16 = (long)(int)auVar33._0_4_ * 0x38;
  lVar20 = *(long *)(lVar15 + lVar16);
  lVar8 = *(long *)(lVar15 + 0x10 + lVar16);
  auVar33 = *(undefined1 (*) [16])(lVar20 + lVar8 * uVar14);
  uVar17 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar34 = *(undefined1 (*) [16])(lVar20 + lVar8 * uVar17);
  uVar18 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar28 = *(undefined1 (*) [16])(lVar20 + lVar8 * uVar18);
  uVar19 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar5 = *(undefined1 (*) [16])(lVar20 + lVar8 * uVar19);
  auVar23 = vunpcklps_avx(auVar33,auVar28);
  auVar29 = vunpckhps_avx(auVar33,auVar28);
  auVar33 = vunpcklps_avx(auVar34,auVar5);
  auVar30 = vunpckhps_avx(auVar34,auVar5);
  auVar36 = vunpcklps_avx(auVar23,auVar33);
  auVar23 = vunpckhps_avx(auVar23,auVar33);
  auVar22 = vunpcklps_avx(auVar29,auVar30);
  lVar20 = *(long *)(lVar15 + 0x38 + lVar16);
  lVar15 = *(long *)(lVar15 + 0x48 + lVar16);
  auVar33 = *(undefined1 (*) [16])(lVar20 + uVar14 * lVar15);
  auVar34 = *(undefined1 (*) [16])(lVar20 + uVar17 * lVar15);
  auVar28 = *(undefined1 (*) [16])(lVar20 + uVar18 * lVar15);
  auVar5 = *(undefined1 (*) [16])(lVar20 + lVar15 * uVar19);
  auVar61 = vunpcklps_avx(auVar33,auVar28);
  auVar37 = vunpckhps_avx(auVar33,auVar28);
  auVar33 = vunpcklps_avx(auVar34,auVar5);
  auVar31 = vunpckhps_avx(auVar34,auVar5);
  auVar28 = vunpcklps_avx(auVar61,auVar33);
  auVar34 = vunpckhps_avx(auVar61,auVar33);
  auVar61 = vunpcklps_avx(auVar37,auVar31);
  auVar33 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
  auVar5 = vshufps_avx(ZEXT416((uint)(1.0 - fVar1)),ZEXT416((uint)(1.0 - fVar1)),0);
  auVar60._8_4_ = 0x3f800000;
  auVar60._0_8_ = &DAT_3f8000003f800000;
  auVar60._12_4_ = 0x3f800000;
  fVar21 = auVar33._0_4_;
  fVar25 = auVar33._4_4_;
  fVar26 = auVar33._8_4_;
  fVar27 = auVar33._12_4_;
  fVar50 = auVar5._0_4_;
  fVar52 = auVar5._4_4_;
  fVar53 = auVar5._8_4_;
  fVar54 = auVar5._12_4_;
  auVar32._0_4_ = fVar50 * auVar36._0_4_ + auVar28._0_4_ * fVar21;
  auVar32._4_4_ = fVar52 * auVar36._4_4_ + auVar28._4_4_ * fVar25;
  auVar32._8_4_ = fVar53 * auVar36._8_4_ + auVar28._8_4_ * fVar26;
  auVar32._12_4_ = fVar54 * auVar36._12_4_ + auVar28._12_4_ * fVar27;
  auVar36._0_4_ = auVar34._0_4_ * fVar21 + fVar50 * auVar23._0_4_;
  auVar36._4_4_ = auVar34._4_4_ * fVar25 + fVar52 * auVar23._4_4_;
  auVar36._8_4_ = auVar34._8_4_ * fVar26 + fVar53 * auVar23._8_4_;
  auVar36._12_4_ = auVar34._12_4_ * fVar27 + fVar54 * auVar23._12_4_;
  auVar33 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar28 = vpcmpgtd_avx(auVar33,_DAT_01ff0cf0);
  auVar35._0_4_ = auVar61._0_4_ * fVar21 + fVar50 * auVar22._0_4_;
  auVar35._4_4_ = auVar61._4_4_ * fVar25 + fVar52 * auVar22._4_4_;
  auVar35._8_4_ = auVar61._8_4_ * fVar26 + fVar53 * auVar22._8_4_;
  auVar35._12_4_ = auVar61._12_4_ * fVar27 + fVar54 * auVar22._12_4_;
  local_f8 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  uVar12 = *(undefined4 *)(ray + k * 4);
  auVar23._4_4_ = uVar12;
  auVar23._0_4_ = uVar12;
  auVar23._8_4_ = uVar12;
  auVar23._12_4_ = uVar12;
  auVar23 = vsubps_avx(auVar32,auVar23);
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar33._4_4_ = uVar12;
  auVar33._0_4_ = uVar12;
  auVar33._8_4_ = uVar12;
  auVar33._12_4_ = uVar12;
  auVar36 = vsubps_avx(auVar36,auVar33);
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar34._4_4_ = uVar12;
  auVar34._0_4_ = uVar12;
  auVar34._8_4_ = uVar12;
  auVar34._12_4_ = uVar12;
  auVar22 = vsubps_avx(auVar35,auVar34);
  fVar1 = *(float *)(ray + k * 4 + 0x40);
  fVar2 = *(float *)(ray + k * 4 + 0x50);
  fVar3 = *(float *)(ray + k * 4 + 0x60);
  auVar33 = ZEXT416((uint)(fVar1 * fVar1 + fVar2 * fVar2 + fVar3 * fVar3));
  auVar34 = vshufps_avx(auVar33,auVar33,0);
  auVar33 = vrcpps_avx(auVar34);
  fVar64 = auVar33._0_4_;
  auVar62._0_4_ = fVar64 * auVar34._0_4_;
  fVar66 = auVar33._4_4_;
  auVar62._4_4_ = fVar66 * auVar34._4_4_;
  fVar67 = auVar33._8_4_;
  auVar62._8_4_ = fVar67 * auVar34._8_4_;
  fVar68 = auVar33._12_4_;
  auVar62._12_4_ = fVar68 * auVar34._12_4_;
  auVar33 = vsubps_avx(auVar60,auVar62);
  fVar55 = auVar22._0_4_;
  fVar57 = auVar22._4_4_;
  fVar58 = auVar22._8_4_;
  fVar59 = auVar22._12_4_;
  fVar45 = auVar36._0_4_;
  fVar47 = auVar36._4_4_;
  fVar48 = auVar36._8_4_;
  fVar49 = auVar36._12_4_;
  fVar40 = auVar23._0_4_;
  fVar42 = auVar23._4_4_;
  fVar43 = auVar23._8_4_;
  fVar44 = auVar23._12_4_;
  local_138._0_4_ =
       (fVar40 * fVar1 + fVar45 * fVar2 + fVar55 * fVar3) * (fVar64 + fVar64 * auVar33._0_4_);
  local_138._4_4_ =
       (fVar42 * fVar1 + fVar47 * fVar2 + fVar57 * fVar3) * (fVar66 + fVar66 * auVar33._4_4_);
  local_138._8_4_ =
       (fVar43 * fVar1 + fVar48 * fVar2 + fVar58 * fVar3) * (fVar67 + fVar67 * auVar33._8_4_);
  local_138._12_4_ =
       (fVar44 * fVar1 + fVar49 * fVar2 + fVar59 * fVar3) * (fVar68 + fVar68 * auVar33._12_4_);
  auVar65 = ZEXT1664(local_138);
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar61._4_4_ = uVar12;
  auVar61._0_4_ = uVar12;
  auVar61._8_4_ = uVar12;
  auVar61._12_4_ = uVar12;
  auVar33 = vcmpps_avx(auVar61,local_138,2);
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar63._4_4_ = uVar12;
  auVar63._0_4_ = uVar12;
  auVar63._8_4_ = uVar12;
  auVar63._12_4_ = uVar12;
  auVar34 = vcmpps_avx(local_138,auVar63,2);
  auVar33 = vandps_avx(auVar34,auVar33);
  auVar34 = auVar28 & auVar33;
  if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar34[0xf] < '\0') {
    auVar33 = vandps_avx(auVar33,auVar28);
    auVar34 = vunpckhps_avx(auVar29,auVar30);
    auVar28 = vunpckhps_avx(auVar37,auVar31);
    fVar21 = fVar50 * auVar34._0_4_ + fVar21 * auVar28._0_4_;
    fVar25 = fVar52 * auVar34._4_4_ + fVar25 * auVar28._4_4_;
    fVar26 = fVar53 * auVar34._8_4_ + fVar26 * auVar28._8_4_;
    fVar27 = fVar54 * auVar34._12_4_ + fVar27 * auVar28._12_4_;
    auVar28._0_4_ = local_138._0_4_ * fVar1;
    auVar28._4_4_ = local_138._4_4_ * fVar1;
    auVar28._8_4_ = local_138._8_4_ * fVar1;
    auVar28._12_4_ = local_138._12_4_ * fVar1;
    auVar30._0_4_ = local_138._0_4_ * fVar2;
    auVar30._4_4_ = local_138._4_4_ * fVar2;
    auVar30._8_4_ = local_138._8_4_ * fVar2;
    auVar30._12_4_ = local_138._12_4_ * fVar2;
    auVar37._0_4_ = local_138._0_4_ * fVar3;
    auVar37._4_4_ = local_138._4_4_ * fVar3;
    auVar37._8_4_ = local_138._8_4_ * fVar3;
    auVar37._12_4_ = local_138._12_4_ * fVar3;
    auVar34 = vsubps_avx(auVar23,auVar28);
    auVar28 = vsubps_avx(auVar36,auVar30);
    auVar23 = vsubps_avx(auVar22,auVar37);
    auVar29._0_4_ =
         auVar34._0_4_ * auVar34._0_4_ +
         auVar28._0_4_ * auVar28._0_4_ + auVar23._0_4_ * auVar23._0_4_;
    auVar29._4_4_ =
         auVar34._4_4_ * auVar34._4_4_ +
         auVar28._4_4_ * auVar28._4_4_ + auVar23._4_4_ * auVar23._4_4_;
    auVar29._8_4_ =
         auVar34._8_4_ * auVar34._8_4_ +
         auVar28._8_4_ * auVar28._8_4_ + auVar23._8_4_ * auVar23._8_4_;
    auVar29._12_4_ =
         auVar34._12_4_ * auVar34._12_4_ +
         auVar28._12_4_ * auVar28._12_4_ + auVar23._12_4_ * auVar23._12_4_;
    auVar22._0_4_ = fVar21 * fVar21;
    auVar22._4_4_ = fVar25 * fVar25;
    auVar22._8_4_ = fVar26 * fVar26;
    auVar22._12_4_ = fVar27 * fVar27;
    auVar34 = vcmpps_avx(auVar29,auVar22,2);
    auVar28 = auVar33 & auVar34;
    if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar28[0xf] < '\0')
    {
      auVar33 = vandps_avx(auVar33,auVar34);
      auVar31._0_4_ = fVar40 * fVar40 + fVar45 * fVar45 + fVar55 * fVar55;
      auVar31._4_4_ = fVar42 * fVar42 + fVar47 * fVar47 + fVar57 * fVar57;
      auVar31._8_4_ = fVar43 * fVar43 + fVar48 * fVar48 + fVar58 * fVar58;
      auVar31._12_4_ = fVar44 * fVar44 + fVar49 * fVar49 + fVar59 * fVar59;
      auVar34 = vcmpps_avx(auVar31,auVar22,6);
      auVar28 = auVar34 & auVar33;
      if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar28[0xf] < '\0'
         ) {
        local_1c8 = vandps_avx(auVar33,auVar34);
        auVar23 = ZEXT816(0);
        local_158 = ZEXT1632(auVar23);
        local_128[0] = -fVar1;
        local_128[1] = -fVar1;
        local_128[2] = -fVar1;
        local_128[3] = -fVar1;
        local_118[0] = -fVar2;
        local_118[1] = -fVar2;
        local_118[2] = -fVar2;
        local_118[3] = -fVar2;
        local_108[0] = -fVar3;
        local_108[1] = -fVar3;
        local_108[2] = -fVar3;
        local_108[3] = -fVar3;
        auVar38._8_4_ = 0x7f800000;
        auVar38._0_8_ = 0x7f8000007f800000;
        auVar38._12_4_ = 0x7f800000;
        auVar39 = ZEXT1664(auVar38);
        auVar33 = vblendvps_avx(auVar38,local_138,local_1c8);
        auVar34 = vshufps_avx(auVar33,auVar33,0xb1);
        auVar34 = vminps_avx(auVar34,auVar33);
        auVar28 = vshufpd_avx(auVar34,auVar34,1);
        auVar34 = vminps_avx(auVar28,auVar34);
        auVar34 = vcmpps_avx(auVar33,auVar34,0);
        auVar28 = local_1c8 & auVar34;
        auVar33 = local_1c8;
        if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar28[0xf] < '\0') {
          auVar33 = vandps_avx(auVar34,local_1c8);
        }
        uVar11 = vmovmskps_avx(auVar33);
        lVar15 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
          }
        }
        lVar20 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
        auVar9 = vcmpps_avx(ZEXT1632(auVar23),ZEXT1632(auVar23),0xf);
        auVar41 = ZEXT3264(auVar9);
        auVar46 = ZEXT864(0) << 0x20;
        auVar33 = vpcmpeqd_avx(auVar5,auVar5);
        auVar51 = ZEXT1664(auVar33);
        auVar56 = ZEXT1664(CONCAT88(0x100000001,0x100000001));
        do {
          local_188 = &local_e8;
          local_1a8 = &local_1b8;
          uVar11 = *(uint *)(local_f8 + lVar15 * 4);
          pRVar13 = (RayHitK<4> *)(ulong)uVar11;
          pGVar7 = (pSVar6->geometries).items[(long)pRVar13].ptr;
          if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            *(undefined4 *)(local_1c8 + lVar15 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar12 = *(undefined4 *)(local_158 + lVar15 * 4);
              uVar4 = *(undefined4 *)(local_158 + lVar15 * 4 + 0x10);
              *(float *)(ray + k * 4 + 0x80) = local_128[lVar15 + -4];
              *(float *)(ray + k * 4 + 0xc0) = local_128[lVar15];
              *(float *)(ray + k * 4 + 0xd0) = local_118[lVar15];
              *(float *)(ray + k * 4 + 0xe0) = local_108[lVar15];
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar12;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
              *(uint *)(ray + k * 4 + 0x110) = (Disc->primIDs).field_0.i[lVar15];
              *(uint *)(ray + k * 4 + 0x120) = uVar11;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              return;
            }
            local_b8 = *(undefined4 *)(local_158 + lVar15 * 4);
            local_a8 = *(undefined4 *)(local_158 + lVar15 * 4 + 0x10);
            local_88 = vpshufd_avx(ZEXT416(uVar11),0);
            local_98 = (Disc->primIDs).field_0.i[lVar15];
            fVar1 = local_128[lVar15];
            local_e8._4_4_ = fVar1;
            local_e8._0_4_ = fVar1;
            local_e8._8_4_ = fVar1;
            local_e8._12_4_ = fVar1;
            fVar1 = local_118[lVar15];
            local_d8._4_4_ = fVar1;
            local_d8._0_4_ = fVar1;
            local_d8._8_4_ = fVar1;
            local_d8._12_4_ = fVar1;
            fVar1 = local_108[lVar15];
            local_c8._4_4_ = fVar1;
            local_c8._0_4_ = fVar1;
            local_c8._8_4_ = fVar1;
            local_c8._12_4_ = fVar1;
            uStack_b4 = local_b8;
            uStack_b0 = local_b8;
            uStack_ac = local_b8;
            uStack_a4 = local_a8;
            uStack_a0 = local_a8;
            uStack_9c = local_a8;
            uStack_94 = local_98;
            uStack_90 = local_98;
            uStack_8c = local_98;
            uStack_74 = context->user->instID[0];
            local_78 = uStack_74;
            uStack_70 = uStack_74;
            uStack_6c = uStack_74;
            uStack_68 = context->user->instPrimID[0];
            uStack_64 = uStack_68;
            uStack_60 = uStack_68;
            uStack_5c = uStack_68;
            uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
            *(float *)(ray + k * 4 + 0x80) = local_128[lVar15 + -4];
            local_1b8 = *(undefined8 *)(mm_lookupmask_ps + lVar20);
            uStack_1b0 = *(undefined8 *)(mm_lookupmask_ps + lVar20 + 8);
            local_1a0 = pGVar7->userPtr;
            local_198 = context->user;
            local_180 = 4;
            pRVar13 = (RayHitK<4> *)pGVar7->intersectionFilterN;
            local_168 = auVar65._0_16_;
            local_58 = auVar41._0_32_;
            local_178 = auVar56._0_16_;
            local_190 = ray;
            if (pRVar13 != (RayHitK<4> *)0x0) {
              auVar33 = auVar51._0_16_;
              pRVar13 = (RayHitK<4> *)(*(code *)pRVar13)(&local_1a8);
              auVar56 = ZEXT1664(local_178);
              auVar33 = vpcmpeqd_avx(auVar33,auVar33);
              auVar51 = ZEXT1664(auVar33);
              auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar41 = ZEXT3264(local_58);
              auVar39 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar65 = ZEXT1664(local_168);
            }
            auVar5._8_8_ = uStack_1b0;
            auVar5._0_8_ = local_1b8;
            auVar33 = auVar51._0_16_;
            if (auVar5 == (undefined1  [16])0x0) {
              auVar34 = vpcmpeqd_avx(auVar46._0_16_,(undefined1  [16])0x0);
              auVar33 = auVar33 ^ auVar34;
            }
            else {
              pRVar13 = (RayHitK<4> *)context->args->filter;
              if ((pRVar13 != (RayHitK<4> *)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                pRVar13 = (RayHitK<4> *)(*(code *)pRVar13)(&local_1a8);
                auVar56 = ZEXT1664(local_178);
                auVar33 = vpcmpeqd_avx(auVar33,auVar33);
                auVar51 = ZEXT1664(auVar33);
                auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar41 = ZEXT3264(local_58);
                auVar39 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar65 = ZEXT1664(local_168);
              }
              auVar10._8_8_ = uStack_1b0;
              auVar10._0_8_ = local_1b8;
              auVar34 = vpcmpeqd_avx(auVar46._0_16_,auVar10);
              auVar33 = auVar51._0_16_ ^ auVar34;
              if (auVar10 != (undefined1  [16])0x0) {
                auVar34 = auVar51._0_16_ ^ auVar34;
                auVar28 = vmaskmovps_avx(auVar34,*local_188);
                *(undefined1 (*) [16])(local_190 + 0xc0) = auVar28;
                auVar28 = vmaskmovps_avx(auVar34,local_188[1]);
                *(undefined1 (*) [16])(local_190 + 0xd0) = auVar28;
                auVar28 = vmaskmovps_avx(auVar34,local_188[2]);
                *(undefined1 (*) [16])(local_190 + 0xe0) = auVar28;
                auVar28 = vmaskmovps_avx(auVar34,local_188[3]);
                *(undefined1 (*) [16])(local_190 + 0xf0) = auVar28;
                auVar28 = vmaskmovps_avx(auVar34,local_188[4]);
                *(undefined1 (*) [16])(local_190 + 0x100) = auVar28;
                auVar28 = vmaskmovps_avx(auVar34,local_188[5]);
                *(undefined1 (*) [16])(local_190 + 0x110) = auVar28;
                auVar28 = vmaskmovps_avx(auVar34,local_188[6]);
                *(undefined1 (*) [16])(local_190 + 0x120) = auVar28;
                auVar28 = vmaskmovps_avx(auVar34,local_188[7]);
                *(undefined1 (*) [16])(local_190 + 0x130) = auVar28;
                auVar34 = vmaskmovps_avx(auVar34,local_188[8]);
                *(undefined1 (*) [16])(local_190 + 0x140) = auVar34;
                pRVar13 = local_190;
              }
            }
            if ((auVar56._0_16_ & auVar33) == (undefined1  [16])0x0) {
              *(undefined4 *)(ray + k * 4 + 0x80) = uVar12;
            }
            *(undefined4 *)(local_1c8 + lVar15 * 4) = 0;
            uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar24._4_4_ = uVar12;
            auVar24._0_4_ = uVar12;
            auVar24._8_4_ = uVar12;
            auVar24._12_4_ = uVar12;
            auVar33 = vcmpps_avx(auVar65._0_16_,auVar24,2);
            local_1c8 = vandps_avx(auVar33,local_1c8);
          }
          if ((((local_1c8 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (local_1c8 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (local_1c8 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < local_1c8[0xf]) {
            return;
          }
          auVar33 = vblendvps_avx(auVar39._0_16_,auVar65._0_16_,local_1c8);
          auVar34 = vshufps_avx(auVar33,auVar33,0xb1);
          auVar34 = vminps_avx(auVar34,auVar33);
          auVar28 = vshufpd_avx(auVar34,auVar34,1);
          auVar34 = vminps_avx(auVar28,auVar34);
          auVar34 = vcmpps_avx(auVar33,auVar34,0);
          auVar28 = local_1c8 & auVar34;
          auVar33 = local_1c8;
          if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar28[0xf] < '\0') {
            auVar33 = vandps_avx(auVar34,local_1c8);
          }
          uVar12 = vmovmskps_avx(auVar33);
          uVar14 = CONCAT44((int)((ulong)pRVar13 >> 0x20),uVar12);
          lVar15 = 0;
          if (uVar14 != 0) {
            for (; (uVar14 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }